

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::operator==(Optional<Catch::ColourMode> *a,Optional<Catch::ColourMode> *b)

{
  ColourMode CVar1;
  ColourMode *pCVar2;
  bool bVar3;
  
  bVar3 = a->nullableValue == (ColourMode *)0x0 && b->nullableValue == (ColourMode *)0x0;
  if (b->nullableValue != (ColourMode *)0x0 && a->nullableValue != (ColourMode *)0x0) {
    pCVar2 = Optional<Catch::ColourMode>::operator*(a);
    CVar1 = *pCVar2;
    pCVar2 = Optional<Catch::ColourMode>::operator*(b);
    bVar3 = CVar1 == *pCVar2;
  }
  return bVar3;
}

Assistant:

bool operator==(Optional const& a, Optional const& b) {
            if (a.none() && b.none()) {
                return true;
            } else if (a.some() && b.some()) {
                return *a == *b;
            } else {
                return false;
            }
        }